

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O2

int run_helper_tcp4_echo_server(void)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  size_t __size;
  int64_t eval_a;
  sockaddr_in addr;
  
  loop = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/echo-server.c"
            ,0xff,"uv_ip4_addr(\"127.0.0.1\", port, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  server = (uv_handle_t *)&tcpServer;
  serverType = TCP;
  iVar1 = uv_tcp_init(loop,&tcpServer);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_bind(&tcpServer,(sockaddr *)&addr,0);
    if (iVar1 == 0) {
      iVar1 = uv_listen((uv_stream_t *)&tcpServer,0x1000,on_connection);
      __stream = _stderr;
      if (iVar1 != 0) {
        pcVar2 = uv_err_name(iVar1);
        fprintf(__stream,"Listen error %s\n",pcVar2);
        return 1;
      }
      notify_parent_process();
      uv_run(loop,UV_RUN_DEFAULT);
      return 0;
    }
    pcVar2 = "Bind error\n";
    __size = 0xb;
  }
  else {
    pcVar2 = "Socket creation error\n";
    __size = 0x16;
  }
  fwrite(pcVar2,__size,1,_stderr);
  return 1;
}

Assistant:

HELPER_IMPL(tcp4_echo_server) {
  loop = uv_default_loop();

  if (tcp4_echo_start(TEST_PORT))
    return 1;

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);
  return 0;
}